

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O3

void __thiscall mnf::SO3<mnf::ExpMapMatrix>::SO3(SO3<mnf::ExpMapMatrix> *this)

{
  ulong uVar1;
  ConstRefVec local_58;
  undefined8 local_28;
  
  mnf::Manifold::Manifold(&this->super_Manifold,3,3,9);
  *(undefined ***)this = &PTR__SO3_0012b968;
  mnf::ReusableTemporaryMap::ReusableTemporaryMap(&this->bufferMap_,0x100);
  uVar1 = mnf::Manifold::name_abi_cxx11_();
  std::__cxx11::string::_M_replace(uVar1,0,*(char **)(uVar1 + 8),0x125c7a);
  local_28 = 0x400921fb54442d18;
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = (PointerType)0x0;
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_rows.m_value = 0;
  local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  construct<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ();
  setTypicalMagnitude(this,&local_58);
  free(local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  local_28 = 0x400921fb54442d18;
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_data = (PointerType)0x0;
  local_58.
  super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
  .
  super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
  .m_rows.m_value = 0;
  local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
       = (double *)0x0;
  local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
       = 0;
  Eigen::Ref<Eigen::Matrix<double,-1,1,0,-1,1>const,0,Eigen::InnerStride<1>>::
  construct<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>> *)&local_58);
  setTrustMagnitude(this,&local_58);
  free(local_58.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return;
}

Assistant:

inline SO3<Map>::SO3()
    : Manifold(3, Map::InputDim_, Map::OutputDim_)
{
  name() = "SO3";
  setTypicalMagnitude(Eigen::Vector3d::Constant(M_PI));
  setTrustMagnitude(Eigen::Vector3d::Constant(M_PI));
}